

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of-test.c++
# Opt level: O3

void __thiscall kj::TestCase101::run(TestCase101 *this)

{
  uint uVar1;
  uint count;
  DebugComparison<kj::StringPtr,_const_char_(&)[4]> _kjCondition;
  uint local_54;
  undefined1 local_50 [40];
  bool local_28;
  DebugExpression<kj::StringPtr> local_20;
  
  local_54 = 0;
  local_20.value.content.ptr = "foo";
  local_20.value.content.size_ = 4;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_50,&local_20,
             (char (*) [4])0x4d8ac4);
  if (kj::_::Debug::minSeverity < 3 && local_28 == false) {
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x70,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_50);
  }
  else {
    local_54 = 0;
  }
  uVar1 = local_54 + 1;
  local_50._0_8_ = &local_54;
  local_50._8_4_ = 1;
  local_50._16_8_ = " == ";
  local_50._24_8_ = &DAT_00000005;
  local_50[0x20] = local_54 == 0;
  local_54 = uVar1;
  if ((!local_50[0x20]) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x79,ERROR,"\"failed: expected \" \"count == 1\", _kjCondition",
               (char (*) [28])"failed: expected count == 1",
               (DebugComparison<unsigned_int_&,_int> *)local_50);
  }
  local_20.value.content.ptr = "foo";
  local_20.value.content.size_ = 4;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_50,&local_20,
             (char (*) [4])0x4d8ac4);
  if ((local_28 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x81,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_50);
  }
  local_20.value.content.ptr = "foo";
  local_20.value.content.size_ = 4;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_50,&local_20,
             (char (*) [4])0x4d8ac4);
  if ((local_28 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x91,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_50);
  }
  return;
}

Assistant:

TEST(OneOf, Switch) {
  OneOf<int, float, const char*> var;
  var = "foo";
  uint count = 0;

  {
    KJ_SWITCH_ONEOF(var) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
        ++count;
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  KJ_EXPECT(count == 1);

  {
    KJ_SWITCH_ONEOF(kj::cp(var)) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  {
    // At one time this failed to compile.
    const auto& constVar = var;
    KJ_SWITCH_ONEOF(constVar) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }
}